

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::anon_unknown_7::TileBufferTask::TileBufferTask
          (TileBufferTask *this,TaskGroup *group,Data *ofd,int number,int dx,int dy,int lx,int ly)

{
  long lVar1;
  TileBuffer *pTVar2;
  uint in_ECX;
  undefined8 in_RDX;
  TaskGroup *in_RSI;
  void *__stat_loc;
  Task *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  Data *in_stack_ffffffffffffffb0;
  undefined8 local_44;
  undefined8 local_3c;
  int local_24;
  int local_20;
  uint local_1c;
  undefined8 local_18;
  
  local_24 = in_R9D;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_RDX;
  IlmThread_2_5::Task::Task(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__TileBufferTask_00562b28;
  *(undefined8 *)(in_RDI + 0x10) = local_18;
  __stat_loc = (void *)(ulong)local_1c;
  pTVar2 = DeepTiledOutputFile::Data::getTileBuffer
                     (in_stack_ffffffffffffffb0,(int)((ulong)(in_RDI + 0x18) >> 0x20));
  *(TileBuffer **)(in_RDI + 0x18) = pTVar2;
  TileBuffer::wait(*(TileBuffer **)(in_RDI + 0x18),__stat_loc);
  TileCoord::TileCoord((TileCoord *)&local_44,local_20,local_24,in_stack_00000008,in_stack_00000010)
  ;
  lVar1 = *(long *)(in_RDI + 0x18);
  *(undefined8 *)(lVar1 + 0x58) = local_44;
  *(undefined8 *)(lVar1 + 0x60) = local_3c;
  return;
}

Assistant:

TileBufferTask::TileBufferTask
    (TaskGroup *group,
     DeepTiledOutputFile::Data *ofd,
     int number,
     int dx, int dy,
     int lx, int ly)
:
    Task (group),
    _ofd (ofd),
    _tileBuffer (_ofd->getTileBuffer (number))
{
    //
    // Wait for the tileBuffer to become available
    //

    _tileBuffer->wait ();
    _tileBuffer->tileCoord = TileCoord (dx, dy, lx, ly);
}